

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall
CVmObjLookupTable::get_nth_ele
          (CVmObjLookupTable *this,vm_val_t *key,vm_val_t *val,vm_obj_id_t self,long idx)

{
  undefined4 uVar1;
  vm_lookup_ext *pvVar2;
  undefined8 *in_RDX;
  vm_val_t *in_RSI;
  CVmObjLookupTable *in_RDI;
  long in_R8;
  vm_lookup_val *entry;
  uint i;
  vm_lookup_val *local_38;
  uint local_2c;
  long local_28;
  
  if (in_R8 == 0) {
    if (in_RSI != (vm_val_t *)0x0) {
      vm_val_t::set_nil(in_RSI);
    }
    if (in_RDX != (undefined8 *)0x0) {
      pvVar2 = get_ext(in_RDI);
      *in_RDX = *(undefined8 *)&pvVar2->default_value;
      *(anon_union_8_8_cb74652f_for_val *)(in_RDX + 1) = (pvVar2->default_value).val;
    }
  }
  else {
    local_2c = get_entry_count((CVmObjLookupTable *)0x36ac58);
    pvVar2 = get_ext(in_RDI);
    local_38 = vm_lookup_ext::idx_to_val(pvVar2,0);
    local_28 = in_R8;
    while( true ) {
      if (local_2c == 0) {
        err_throw(0);
      }
      if (((local_38->key).typ != VM_EMPTY) && (local_28 = local_28 + -1, local_28 == 0)) break;
      local_2c = local_2c - 1;
      local_38 = local_38 + 1;
    }
    if (in_RSI != (vm_val_t *)0x0) {
      uVar1 = *(undefined4 *)&(local_38->key).field_0x4;
      in_RSI->typ = (local_38->key).typ;
      *(undefined4 *)&in_RSI->field_0x4 = uVar1;
      in_RSI->val = (local_38->key).val;
    }
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = *(undefined8 *)&local_38->val;
      *(anon_union_8_8_cb74652f_for_val *)(in_RDX + 1) = (local_38->val).val;
    }
  }
  return;
}

Assistant:

void CVmObjLookupTable::get_nth_ele(VMG_ vm_val_t *key, vm_val_t *val,
                                    vm_obj_id_t self, long idx)
{
    uint i;
    vm_lookup_val *entry;

    /* 
     *   if the index is zero, and we're asking for the value, return the
     *   default value 
     */
    if (idx == 0)
    {
        if (key != 0)
            key->set_nil();
        if (val != 0)
            *val = get_ext()->default_value;
        return;
    }
    
    /* iterate over our buckets */
    for (i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; --i, ++entry)
    {
        /* if it's in use (i.e., the key isn't empty), count it */
        if (entry->key.typ != VM_EMPTY)
        {
            /* count it */
            --idx;

            /* if this is the one we're looking for, return it */
            if (idx == 0)
            {
                /* fill in the key and/or value elements */
                if (key != 0)
                    *key = entry->key;
                if (val != 0)
                    *val = entry->val;

                /* done */
                return;
            }
        }
    }

    /* we didn't find it - the index is out of range */
    err_throw(VMERR_INDEX_OUT_OF_RANGE);
}